

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int int32_encode(cram_fd *fd,int32_t val)

{
  ssize_t sVar1;
  int32_t local_1c;
  cram_fd *pcStack_18;
  int32_t val_local;
  cram_fd *fd_local;
  
  local_1c = val;
  pcStack_18 = fd;
  sVar1 = hwrite(fd->fp,&local_1c,4);
  if (sVar1 == 4) {
    fd_local._4_4_ = 4;
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int int32_encode(cram_fd *fd, int32_t val) {
    val = le_int4(val);
    if (4 != hwrite(fd->fp, &val, 4))
	return -1;

    return 4;
}